

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O0

void Gia_ManDomTest(Gia_Man_t *p)

{
  int iVar1;
  uint v;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *vSupp_00;
  Vec_Wec_t *p_01;
  Vec_Wec_t *p_02;
  Vec_Int_t *pVVar4;
  Vec_Int_t *p2;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  int nMffcSize;
  int Id;
  int i;
  Gia_Obj_t *pDom;
  Gia_Obj_t *pObj;
  Vec_Wec_t *vDomeds;
  Vec_Wec_t *vSupps;
  Vec_Int_t *vSupp;
  Vec_Int_t *vDoms;
  Gia_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(100);
  vSupp_00 = Vec_IntAlloc(100);
  p_01 = Gia_ManCreateSupps(p,1);
  iVar1 = Gia_ManObjNum(p);
  p_02 = Vec_WecStart(iVar1);
  Gia_ManCreateRefs(p);
  Gia_ManComputeDoms(p);
  nMffcSize = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar6 = false;
    if (nMffcSize < iVar1) {
      pDom = Gia_ManCi(p,nMffcSize);
      bVar6 = pDom != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjDom(p,pDom);
    if (iVar1 != -1) {
      iVar1 = Gia_ObjDom(p,pDom);
      _Id = Gia_ManObj(p,iVar1);
      while (iVar1 = Gia_ObjIsAnd(_Id), iVar1 != 0) {
        iVar1 = Gia_ObjId(p,_Id);
        pVVar4 = Vec_WecEntry(p_02,iVar1);
        Vec_IntPush(pVVar4,nMffcSize);
        iVar1 = Gia_ObjDom(p,_Id);
        _Id = Gia_ManObj(p,iVar1);
      }
    }
    nMffcSize = nMffcSize + 1;
  }
  nMffcSize = 0;
  while( true ) {
    bVar6 = false;
    if (nMffcSize < p->nObjs) {
      pDom = Gia_ManObj(p,nMffcSize);
      bVar6 = pDom != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjIsAnd(pDom);
    if (iVar1 != 0) {
      pVVar4 = Vec_WecEntry(p_01,nMffcSize);
      p2 = Vec_WecEntry(p_02,nMffcSize);
      iVar1 = Vec_IntEqual(pVVar4,p2);
      if (iVar1 != 0) {
        Vec_IntPush(p_00,nMffcSize);
      }
    }
    nMffcSize = nMffcSize + 1;
  }
  Vec_WecFree(p_01);
  Vec_WecFree(p_02);
  for (nMffcSize = 0; iVar1 = Vec_IntSize(p_00), nMffcSize < iVar1; nMffcSize = nMffcSize + 1) {
    iVar1 = Vec_IntEntry(p_00,nMffcSize);
    pGVar5 = Gia_ManObj(p,iVar1);
    Gia_ObjRefInc(p,pGVar5);
  }
  for (nMffcSize = 0; iVar1 = Vec_IntSize(p_00), nMffcSize < iVar1; nMffcSize = nMffcSize + 1) {
    v = Vec_IntEntry(p_00,nMffcSize);
    pGVar5 = Gia_ManObj(p,v);
    uVar2 = Gia_NodeMffcSizeSupp(p,pGVar5,vSupp_00);
    uVar3 = Vec_IntSize(vSupp_00);
    printf("%d(%d:%d) ",(ulong)v,(ulong)uVar3,(ulong)uVar2);
  }
  printf("\n");
  for (nMffcSize = 0; iVar1 = Vec_IntSize(p_00), nMffcSize < iVar1; nMffcSize = nMffcSize + 1) {
    iVar1 = Vec_IntEntry(p_00,nMffcSize);
    pGVar5 = Gia_ManObj(p,iVar1);
    Gia_ObjRefDec(p,pGVar5);
  }
  Vec_IntFree(p_00);
  Vec_IntFree(vSupp_00);
  return;
}

Assistant:

void Gia_ManDomTest( Gia_Man_t * p )
{
    Vec_Int_t * vDoms = Vec_IntAlloc( 100 );
    Vec_Int_t * vSupp = Vec_IntAlloc( 100 );
    Vec_Wec_t * vSupps = Gia_ManCreateSupps( p, 1 );
    Vec_Wec_t * vDomeds = Vec_WecStart( Gia_ManObjNum(p) );
    Gia_Obj_t * pObj, * pDom; int i, Id, nMffcSize;
    Gia_ManCreateRefs( p );
    Gia_ManComputeDoms( p );
    Gia_ManForEachCi( p, pObj, i )
    {
        if ( Gia_ObjDom(p, pObj) == -1 )
            continue;
        for ( pDom = Gia_ManObj(p, Gia_ObjDom(p, pObj)); Gia_ObjIsAnd(pDom); pDom = Gia_ManObj(p, Gia_ObjDom(p, pDom)) )
            Vec_IntPush( Vec_WecEntry(vDomeds, Gia_ObjId(p, pDom)), i );
    }
    Gia_ManForEachAnd( p, pObj, i )
        if ( Vec_IntEqual(Vec_WecEntry(vSupps, i), Vec_WecEntry(vDomeds, i)) )
            Vec_IntPush( vDoms, i );
    Vec_WecFree( vSupps );
    Vec_WecFree( vDomeds );

    // check MFFC sizes
    Vec_IntForEachEntry( vDoms, Id, i )
        Gia_ObjRefInc( p, Gia_ManObj(p, Id) );
    Vec_IntForEachEntry( vDoms, Id, i )
    {
        nMffcSize = Gia_NodeMffcSizeSupp( p, Gia_ManObj(p, Id), vSupp );
        printf( "%d(%d:%d) ", Id, Vec_IntSize(vSupp), nMffcSize );
    }
    printf( "\n" );
    Vec_IntForEachEntry( vDoms, Id, i )
        Gia_ObjRefDec( p, Gia_ManObj(p, Id) );

//    Vec_IntPrint( vDoms );
    Vec_IntFree( vDoms );
    Vec_IntFree( vSupp );
}